

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void mouse_handling::onMouseButton(GLFWwindow *window,int button,int action,int mods)

{
  ImGuiIO *pIVar1;
  int mods_local;
  int action_local;
  int button_local;
  GLFWwindow *window_local;
  
  pIVar1 = ImGui::GetIO();
  if ((pIVar1->WantCaptureMouse & 1U) == 0) {
    if (button == 0) {
      pressed = action == 1;
    }
    if (button == 2) {
      middlePressed = action == 1;
    }
  }
  return;
}

Assistant:

void onMouseButton(GLFWwindow* window, int button, int action, int mods)
    {
        if(ImGui::GetIO().WantCaptureMouse)
            return; // the mouse is captured by imgui
        if(button == GLFW_MOUSE_BUTTON_LEFT)
            pressed = action == GLFW_PRESS;
        if(button == GLFW_MOUSE_BUTTON_MIDDLE)
            middlePressed = action == GLFW_PRESS;
    }